

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O1

DWARFDebugFrame * __thiscall llvm::DWARFContext::getDebugFrame(DWARFContext *this)

{
  DWARFObject *pDVar1;
  DWARFDataExtractor Data;
  StringRef SVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ArchType Arch;
  undefined4 extraout_var;
  DWARFDebugFrame *pDVar7;
  undefined4 extraout_var_00;
  unique_ptr<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_> *this_00;
  undefined6 uStack_56;
  
  pDVar7 = (this->DebugFrame)._M_t.
           super___uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFDebugFrame_*,_std::default_delete<llvm::DWARFDebugFrame>_>
           .super__Head_base<0UL,_llvm::DWARFDebugFrame_*,_false>._M_head_impl;
  if (pDVar7 == (DWARFDebugFrame *)0x0) {
    pDVar1 = (this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
    iVar3 = (*pDVar1->_vptr_DWARFObject[0xd])(pDVar1);
    iVar4 = (*((this->DObj)._M_t.
               super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
               .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
              _vptr_DWARFObject[5])();
    iVar5 = (*((this->DObj)._M_t.
               super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
               .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
              _vptr_DWARFObject[6])();
    SVar2 = *(StringRef *)CONCAT44(extraout_var,iVar3);
    pDVar7 = (DWARFDebugFrame *)operator_new(0x28);
    iVar6 = (*((this->DObj)._M_t.
               super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
               .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
              _vptr_DWARFObject[3])();
    Arch = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar6) + 0x160))
                     ((long *)CONCAT44(extraout_var_00,iVar6));
    DWARFDebugFrame::DWARFDebugFrame(pDVar7,Arch,false,0);
    this_00 = &this->DebugFrame;
    std::__uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>::reset
              ((__uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>
                *)this_00,pDVar7);
    Data.super_DataExtractor.AddressSize = (char)iVar5;
    Data.super_DataExtractor.IsLittleEndian = (char)iVar4;
    Data.super_DataExtractor._18_6_ = uStack_56;
    Data.super_DataExtractor.Data = SVar2;
    Data.Obj = pDVar1;
    Data.Section = (DWARFSection *)CONCAT44(extraout_var,iVar3);
    DWARFDebugFrame::parse
              ((this_00->_M_t).
               super___uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>
               ._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFDebugFrame_*,_std::default_delete<llvm::DWARFDebugFrame>_>
               .super__Head_base<0UL,_llvm::DWARFDebugFrame_*,_false>._M_head_impl,Data);
    pDVar7 = (this_00->_M_t).
             super___uniq_ptr_impl<llvm::DWARFDebugFrame,_std::default_delete<llvm::DWARFDebugFrame>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFDebugFrame_*,_std::default_delete<llvm::DWARFDebugFrame>_>
             .super__Head_base<0UL,_llvm::DWARFDebugFrame_*,_false>._M_head_impl;
  }
  return pDVar7;
}

Assistant:

const DWARFDebugFrame *DWARFContext::getDebugFrame() {
  if (DebugFrame)
    return DebugFrame.get();

  // There's a "bug" in the DWARFv3 standard with respect to the target address
  // size within debug frame sections. While DWARF is supposed to be independent
  // of its container, FDEs have fields with size being "target address size",
  // which isn't specified in DWARF in general. It's only specified for CUs, but
  // .eh_frame can appear without a .debug_info section. Follow the example of
  // other tools (libdwarf) and extract this from the container (ObjectFile
  // provides this information). This problem is fixed in DWARFv4
  // See this dwarf-discuss discussion for more details:
  // http://lists.dwarfstd.org/htdig.cgi/dwarf-discuss-dwarfstd.org/2011-December/001173.html
  DWARFDataExtractor debugFrameData(*DObj, DObj->getFrameSection(),
                                    isLittleEndian(), DObj->getAddressSize());
  DebugFrame.reset(new DWARFDebugFrame(getArch(), false /* IsEH */));
  DebugFrame->parse(debugFrameData);
  return DebugFrame.get();
}